

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void AssertCorrectModifiersInTemplate(Template *tpl,string *text,string *expected_out)

{
  bool bVar1;
  long lVar2;
  string out;
  string dump_out;
  string local_50 [32];
  
  if (tpl == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0xea,"tpl");
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0xea,
                  "void AssertCorrectModifiersInTemplate(Template *, const string &, const string &)"
                 );
  }
  dump_out._M_dataplus._M_p = (pointer)&dump_out.field_2;
  dump_out._M_string_length = 0;
  dump_out.field_2._M_local_buf[0] = '\0';
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  ctemplate::Template::DumpToString((char *)tpl,(string *)"bogus_filename");
  while( true ) {
    lVar2 = std::__cxx11::string::find((char *)&dump_out,0x122762);
    if (lVar2 == -1) break;
    std::__cxx11::string::find((char *)&dump_out,0x1203d6);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&dump_out);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::append((char *)&out);
  }
  bVar1 = anon_unknown.dwarf_d96b::StrEqVerbose(expected_out,&out,text);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&dump_out);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xf5,"StrEqVerbose(expected_out, out, text)");
  bVar1 = anon_unknown.dwarf_d96b::StrEqVerbose(expected_out,&out,text);
  if (bVar1) {
    exit(1);
  }
  __assert_fail("StrEqVerbose(expected_out, out, text)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0xf5,
                "void AssertCorrectModifiersInTemplate(Template *, const string &, const string &)")
  ;
}

Assistant:

static void AssertCorrectModifiersInTemplate(Template* tpl,
                                             const string& text,
                                             const string& expected_out) {
  ASSERT(tpl);
  string dump_out, out;
  tpl->DumpToString("bogus_filename", &dump_out);
  string::size_type i, j;
  i = 0;
  while ((i = dump_out.find("Variable Node: ", i)) != string::npos) {
    i += strlen("Variable Node: ");
    j = dump_out.find("\n", i);
    out.append(dump_out.substr(i, j - i));   // should be safe.
    out.append("\n");
  }
  ASSERT_STREQ_VERBOSE(expected_out, out, text);
}